

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O1

void __thiscall
cfd::core::AbstractTransaction::AddScriptWitnessStack
          (AbstractTransaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  wally_tx *tx;
  wally_tx_witness_stack *pwVar1;
  uchar *witness;
  ulong index;
  wally_tx_witness_stack *pwVar2;
  CfdException *this_00;
  uchar *witness_len;
  undefined4 in_register_00000034;
  int ret;
  wally_tx_witness_stack *stack_pointer;
  string function_name;
  int local_7c;
  wally_tx_witness_stack *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [32];
  
  index = (ulong)tx_in_index;
  (*this->_vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x1b2,"AddScriptWitnessStack");
  tx = (wally_tx *)this->wally_tx_pointer_;
  if (index < tx->num_inputs) {
    local_7c = 0;
    local_78 = (wally_tx_witness_stack *)0x0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"wally_tx_witness_stack_init_alloc","");
    pwVar1 = tx->inputs[index].witness;
    pwVar2 = pwVar1;
    if (pwVar1 == (wally_tx_witness_stack *)0x0) {
      local_7c = wally_tx_witness_stack_init_alloc(1,&local_78);
      pwVar2 = local_78;
    }
    local_78 = pwVar2;
    if (local_7c == 0) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_70,0,(char *)local_70._M_string_length,0x599a2f);
      witness = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      witness_len = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish + -(long)witness;
      if (witness_len == (uchar *)0x0) {
        witness_len = (uchar *)0x0;
        witness = (uchar *)0x0;
      }
      local_7c = wally_tx_witness_stack_add(local_78,witness,(size_t)witness_len);
      if ((pwVar1 == (wally_tx_witness_stack *)0x0) && (local_7c == 0)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&local_70,0,(char *)local_70._M_string_length,0x599a4a);
        local_7c = wally_tx_set_input_witness(tx,index,local_78);
      }
      if (local_78 != (wally_tx_witness_stack *)0x0 && pwVar1 == (wally_tx_witness_stack *)0x0) {
        wally_tx_witness_stack_free(local_78);
      }
    }
    if (local_7c != 0) {
      local_50._0_8_ = "cfdcore_transaction_common.cpp";
      local_50._8_4_ = 0x1e0;
      local_50._16_8_ = "AddScriptWitnessStack";
      logger::log<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"{} NG[{}].",&local_70,&local_7c)
      ;
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"witness stack error.","");
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void AbstractTransaction::AddScriptWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_OK;
    bool is_alloc = false;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally_tx_witness_stack_init_alloc";
    if (tx_pointer->inputs[tx_in_index].witness == NULL) {
      is_alloc = true;
      ret = wally_tx_witness_stack_init_alloc(1, &stack_pointer);
    } else {
      stack_pointer = tx_pointer->inputs[tx_in_index].witness;
    }

    if (ret == WALLY_OK) {
      try {
        // append witness stack
        function_name = "wally_tx_witness_stack_add";
        if (data.empty()) {
          ret = wally_tx_witness_stack_add(stack_pointer, NULL, 0);
        } else {
          ret = wally_tx_witness_stack_add(
              stack_pointer, data.data(), data.size());
        }

        // append tx input
        if (is_alloc && (ret == WALLY_OK)) {
          function_name = "wally_tx_set_input_witness";
          ret = wally_tx_set_input_witness(
              tx_pointer, tx_in_index, stack_pointer);
        }
      } catch (...) {
        // internal error.
        warn(CFD_LOG_SOURCE, "system error.");
        ret = WALLY_ERROR;
      }

      if (is_alloc && stack_pointer) {
        wally_tx_witness_stack_free(stack_pointer);
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack error.");
    }
  }
}